

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStackSwitch(InternalAnalyzer *this,StackSwitch *curr)

{
  bool bVar1;
  StackSwitch *curr_local;
  InternalAnalyzer *this_local;
  
  this->parent->calls = true;
  this->parent->implicitTrap = true;
  bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
  if ((bVar1) && (this->parent->tryDepth == 0)) {
    this->parent->throws_ = true;
  }
  return;
}

Assistant:

void visitStackSwitch(StackSwitch* curr) {
      // This acts as a kitchen sink effect.
      parent.calls = true;

      // switch instructions accept nullable continuation references
      // and trap on null.
      parent.implicitTrap = true;

      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
    }